

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

int debug_putchunkname(SBuf *sb,GCproto *pt,int pathstrip)

{
  char cVar1;
  int iVar2;
  MSize len;
  uint uVar3;
  GCstr *s;
  char *pcVar4;
  
  s = (GCstr *)(ulong)(pt->chunkname).gcptr32;
  if (pt->firstline == -1) {
    lj_buf_putmem(sb,"[builtin:",9);
    lj_buf_putstr(sb,s);
    uVar3 = (sb->p).ptr32;
    pcVar4 = (char *)(ulong)uVar3;
    if ((sb->e).ptr32 == uVar3) {
      pcVar4 = lj_buf_more2(sb,1);
    }
    *pcVar4 = ']';
    (sb->p).ptr32 = (int)pcVar4 + 1;
    iVar2 = 0;
  }
  else {
    cVar1 = (char)s[1].nextgc.gcptr32;
    if ((cVar1 == '@') || (cVar1 == '=')) {
      len = s->len - 1;
      pcVar4 = (char *)((long)&s[1].nextgc.gcptr32 + 1);
      if (pathstrip != 0) {
        for (iVar2 = 0; uVar3 = (s->len - 2) + iVar2, -1 < (int)uVar3; iVar2 = iVar2 + -1) {
          if ((pcVar4[uVar3] == '\\') || (pcVar4[uVar3] == '/')) {
            len = -iVar2;
            pcVar4 = pcVar4 + (ulong)uVar3 + 1;
            break;
          }
        }
      }
    }
    else {
      pcVar4 = "[string]";
      len = 8;
    }
    lj_buf_putmem(sb,pcVar4,len);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int debug_putchunkname(SBuf *sb, GCproto *pt, int pathstrip)
{
  GCstr *name = proto_chunkname(pt);
  const char *p = strdata(name);
  if (pt->firstline == ~(BCLine)0) {
    lj_buf_putmem(sb, "[builtin:", 9);
    lj_buf_putstr(sb, name);
    lj_buf_putb(sb, ']');
    return 0;
  }
  if (*p == '=' || *p == '@') {
    MSize len = name->len-1;
    p++;
    if (pathstrip) {
      int i;
      for (i = len-1; i >= 0; i--)
	if (p[i] == '/' || p[i] == '\\') {
	  len -= i+1;
	  p = p+i+1;
	  break;
	}
    }
    lj_buf_putmem(sb, p, len);
  } else {
    lj_buf_putmem(sb, "[string]", 8);
  }
  return 1;
}